

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O3

void __thiscall
Args::Arg::checkCorrectnessBeforeParsing(Arg *this,StringList *flags,StringList *names)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  logic_error *plVar7;
  size_type *psVar8;
  ulong *puVar9;
  size_type sVar10;
  bool bVar11;
  String flag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  value_type local_118;
  ulong *local_f8;
  long local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong *local_98;
  long local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong *local_78;
  long local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint *local_58;
  undefined8 local_50;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  sVar1 = (this->m_flag)._M_string_length;
  if (sVar1 == 0) {
LAB_0011ee1f:
    if ((this->m_name)._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      if (details::isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_ == '\0')
      {
        iVar3 = __cxa_guard_acquire(&details::isCorrectName(std::__cxx11::string_const&)::
                                     availableSymbols_abi_cxx11_);
        if (iVar3 != 0) {
          details::isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_._0_8_ =
               0x13fc40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     details::isCorrectName(std::__cxx11::string_const&)::
                     availableSymbols_abi_cxx11_,
                     "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-_","");
          __cxa_atexit(std::__cxx11::string::~string,
                       details::isCorrectName(std::__cxx11::string_const&)::
                       availableSymbols_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&details::isCorrectName(std::__cxx11::string_const&)::
                               availableSymbols_abi_cxx11_);
        }
      }
      sVar1 = (this->m_name)._M_string_length;
      if (sVar1 != 0) {
        local_38 = &this->m_name;
        pcVar2 = (this->m_name)._M_dataplus._M_p;
        sVar10 = 0;
        do {
          lVar4 = std::__cxx11::string::find('0',(ulong)(uint)(int)pcVar2[sVar10]);
          if (lVar4 == -1) {
            plVar7 = (logic_error *)__cxa_allocate_exception(0x30);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"Disallowed name \"--","");
            std::operator+(&local_118,&local_138,local_38);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
            local_98 = (ulong *)*plVar5;
            puVar9 = (ulong *)(plVar5 + 2);
            if (local_98 == puVar9) {
              local_88 = *puVar9;
              uStack_80 = plVar5[3];
              local_98 = &local_88;
            }
            else {
              local_88 = *puVar9;
            }
            local_90 = plVar5[1];
            *plVar5 = (long)puVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
            *(undefined ***)plVar7 = &PTR__BaseException_0013eca0;
            *(logic_error **)(plVar7 + 0x10) = plVar7 + 0x20;
            if (local_98 == &local_88) {
              *(undefined4 *)(plVar7 + 0x20) = (undefined4)local_88;
              *(undefined4 *)(plVar7 + 0x24) = local_88._4_4_;
              *(undefined4 *)(plVar7 + 0x28) = (undefined4)uStack_80;
              *(undefined4 *)(plVar7 + 0x2c) = uStack_80._4_4_;
            }
            else {
              *(ulong **)(plVar7 + 0x10) = local_98;
              *(ulong *)(plVar7 + 0x20) = local_88;
            }
            *(long *)(plVar7 + 0x18) = local_90;
            local_90 = 0;
            local_88 = local_88 & 0xffffffffffffff00;
            local_98 = &local_88;
            __cxa_throw(plVar7,&BaseException::typeinfo,BaseException::~BaseException);
          }
          sVar10 = sVar10 + 1;
        } while (sVar1 != sVar10);
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"--","");
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_138,(ulong)(this->m_name)._M_dataplus._M_p);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_118.field_2._M_allocated_capacity = *psVar8;
        local_118.field_2._8_8_ = plVar5[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar8;
        local_118._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_118._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&local_118);
      if (_Var6._M_current !=
          (names->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x30);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Redefinition of argument with name \"","");
        std::operator+(&local_138,&local_b8,&local_118);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_f8 = (ulong *)*plVar5;
        puVar9 = (ulong *)(plVar5 + 2);
        if (local_f8 == puVar9) {
          local_e8 = *puVar9;
          uStack_e0 = plVar5[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *puVar9;
        }
        local_f0 = plVar5[1];
        *plVar5 = (long)puVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
        *(undefined ***)plVar7 = &PTR__BaseException_0013eca0;
        *(logic_error **)(plVar7 + 0x10) = plVar7 + 0x20;
        if (local_f8 == &local_e8) {
          *(undefined4 *)(plVar7 + 0x20) = (undefined4)local_e8;
          *(undefined4 *)(plVar7 + 0x24) = local_e8._4_4_;
          *(undefined4 *)(plVar7 + 0x28) = (undefined4)uStack_e0;
          *(undefined4 *)(plVar7 + 0x2c) = uStack_e0._4_4_;
        }
        else {
          *(ulong **)(plVar7 + 0x10) = local_f8;
          *(ulong *)(plVar7 + 0x20) = local_e8;
        }
        *(long *)(plVar7 + 0x18) = local_f0;
        local_f8 = &local_e8;
        local_f0 = 0;
        local_e8 = local_e8 & 0xffffffffffffff00;
        __cxa_throw(plVar7,&BaseException::typeinfo,BaseException::~BaseException);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(names,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      bVar11 = (this->m_name)._M_string_length == 0;
    }
    if (((this->m_flag)._M_string_length == 0) && (bVar11)) {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x30);
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Arguments with empty flag and name are disallowed.","");
      std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
      *(undefined ***)plVar7 = &PTR__BaseException_0013eca0;
      *(logic_error **)(plVar7 + 0x10) = plVar7 + 0x20;
      if (local_58 == &local_48) {
        *(uint *)(plVar7 + 0x20) = local_48;
        *(undefined4 *)(plVar7 + 0x24) = uStack_44;
        *(undefined4 *)(plVar7 + 0x28) = uStack_40;
        *(undefined4 *)(plVar7 + 0x2c) = uStack_3c;
      }
      else {
        *(uint **)(plVar7 + 0x10) = local_58;
        *(ulong *)(plVar7 + 0x20) = CONCAT44(uStack_44,local_48);
      }
      *(undefined8 *)(plVar7 + 0x18) = local_50;
      local_50 = 0;
      local_48 = local_48 & 0xffffff00;
      local_58 = &local_48;
      __cxa_throw(plVar7,&BaseException::typeinfo,BaseException::~BaseException);
    }
    return;
  }
  if (sVar1 == 1) {
    if (details::isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&details::isCorrectFlag(std::__cxx11::string_const&)::
                                   availableSymbols_abi_cxx11_);
      if (iVar3 != 0) {
        details::isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_._0_8_ =
             0x13fc18;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   details::isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                   "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ","");
        __cxa_atexit(std::__cxx11::string::~string,
                     details::isCorrectFlag(std::__cxx11::string_const&)::
                     availableSymbols_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&details::isCorrectFlag(std::__cxx11::string_const&)::
                             availableSymbols_abi_cxx11_);
      }
    }
    lVar4 = std::__cxx11::string::find
                      (details::isCorrectFlag(std::__cxx11::string_const&)::
                       availableSymbols_abi_cxx11_,(ulong)(this->m_flag)._M_dataplus._M_p,0);
    if (lVar4 != -1) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"-","");
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_138,(ulong)(this->m_flag)._M_dataplus._M_p);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_118.field_2._M_allocated_capacity = *psVar8;
        local_118.field_2._8_8_ = plVar5[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar8;
        local_118._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_118._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((flags->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (flags->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&local_118);
      if (_Var6._M_current !=
          (flags->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x30);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Redefinition of argument with flag \"","");
        std::operator+(&local_138,&local_b8,&local_118);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_d8 = (ulong *)*plVar5;
        puVar9 = (ulong *)(plVar5 + 2);
        if (local_d8 == puVar9) {
          local_c8 = *puVar9;
          uStack_c0 = plVar5[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *puVar9;
        }
        local_d0 = plVar5[1];
        *plVar5 = (long)puVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
        *(undefined ***)plVar7 = &PTR__BaseException_0013eca0;
        *(logic_error **)(plVar7 + 0x10) = plVar7 + 0x20;
        if (local_d8 == &local_c8) {
          *(undefined4 *)(plVar7 + 0x20) = (undefined4)local_c8;
          *(undefined4 *)(plVar7 + 0x24) = local_c8._4_4_;
          *(undefined4 *)(plVar7 + 0x28) = (undefined4)uStack_c0;
          *(undefined4 *)(plVar7 + 0x2c) = uStack_c0._4_4_;
        }
        else {
          *(ulong **)(plVar7 + 0x10) = local_d8;
          *(ulong *)(plVar7 + 0x20) = local_c8;
        }
        *(long *)(plVar7 + 0x18) = local_d0;
        local_d8 = &local_c8;
        local_d0 = 0;
        local_c8 = local_c8 & 0xffffffffffffff00;
        __cxa_throw(plVar7,&BaseException::typeinfo,BaseException::~BaseException);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(flags,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0011ee1f;
    }
  }
  plVar7 = (logic_error *)__cxa_allocate_exception(0x30);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Disallowed flag \"-","");
  std::operator+(&local_118,&local_138,&this->m_flag);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_78 = (ulong *)*plVar5;
  puVar9 = (ulong *)(plVar5 + 2);
  if (local_78 == puVar9) {
    local_68 = *puVar9;
    uStack_60 = plVar5[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar9;
  }
  local_70 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
  *(undefined ***)plVar7 = &PTR__BaseException_0013eca0;
  *(logic_error **)(plVar7 + 0x10) = plVar7 + 0x20;
  if (local_78 == &local_68) {
    *(undefined4 *)(plVar7 + 0x20) = (undefined4)local_68;
    *(undefined4 *)(plVar7 + 0x24) = local_68._4_4_;
    *(undefined4 *)(plVar7 + 0x28) = (undefined4)uStack_60;
    *(undefined4 *)(plVar7 + 0x2c) = uStack_60._4_4_;
  }
  else {
    *(ulong **)(plVar7 + 0x10) = local_78;
    *(ulong *)(plVar7 + 0x20) = local_68;
  }
  *(long *)(plVar7 + 0x18) = local_70;
  local_70 = 0;
  local_68 = local_68 & 0xffffffffffffff00;
  local_78 = &local_68;
  __cxa_throw(plVar7,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

inline void
Arg::checkCorrectnessBeforeParsing( StringList & flags,
	StringList & names ) const
{
	if( !m_flag.empty() )
	{
		if( details::isCorrectFlag( m_flag ) )
		{
			const String flag = String( SL( "-" ) ) + m_flag;

			auto it = std::find( flags.begin(), flags.end(), flag );

			if( it != flags.end() )
				throw BaseException( String( SL( "Redefinition of argument "
					"with flag \"" ) ) + flag + SL( "\"." ) );
			else
				flags.push_back( flag );
		}
		else
			throw BaseException( String( SL( "Disallowed flag \"-" ) ) +
				m_flag + SL( "\"." ) );
	}

	if( !m_name.empty() )
	{
		if( details::isCorrectName( m_name ) )
		{
			const String name = String( SL( "--" ) ) + m_name;

			auto it = std::find( names.begin(), names.end(), name );

			if( it != names.end() )
				throw BaseException( String( SL( "Redefinition of argument "
					"with name \"" ) ) + name + SL( "\"." ) );
			else
				names.push_back( name );
		}
		else
			throw BaseException( String( SL( "Disallowed name \"--" ) ) +
				m_name + SL( "\"." ) );
	}

	if( m_flag.empty() && m_name.empty() )
		throw BaseException( String( SL( "Arguments with empty flag and name "
			"are disallowed." ) ) );
}